

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:410:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
            *this)

{
  bool *pbVar1;
  Mutex *pMVar2;
  Waiter *pWVar3;
  Maybe<kj::_::Mutex::Waiter_&> *pMVar4;
  Maybe<kj::_::Mutex::Waiter_&> **ppMVar5;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    pbVar1 = (this->maybeFunc).ptr.field_1.value.currentlyLocked;
    pMVar2 = (this->maybeFunc).ptr.field_1.value.this;
    pWVar3 = (this->maybeFunc).ptr.field_1.value.waiter;
    (this->maybeFunc).ptr.isSet = false;
    if (*pbVar1 == false) {
      Mutex::lock(pMVar2,0);
    }
    pMVar4 = pWVar3->prev;
    pMVar4->ptr = (pWVar3->next).ptr;
    pWVar3 = (pWVar3->next).ptr;
    ppMVar5 = &pWVar3->prev;
    if (pWVar3 == (Waiter *)0x0) {
      ppMVar5 = &pMVar2->waitersTail;
    }
    *ppMVar5 = pMVar4;
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }